

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2dcf93::DotSuffix::printLeft(DotSuffix *this,OutputStream *s)

{
  Node *pNVar1;
  char *pcVar2;
  size_t sVar3;
  
  pNVar1 = this->Prefix;
  (*pNVar1->_vptr_Node[4])(pNVar1);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,s);
  }
  OutputStream::grow(s,2);
  pcVar2 = s->Buffer;
  sVar3 = s->CurrentPosition;
  (pcVar2 + sVar3)[0] = ' ';
  (pcVar2 + sVar3)[1] = '(';
  s->CurrentPosition = s->CurrentPosition + 2;
  pcVar2 = (this->Suffix).First;
  sVar3 = (long)(this->Suffix).Last - (long)pcVar2;
  if (sVar3 != 0) {
    OutputStream::grow(s,sVar3);
    memmove(s->Buffer + s->CurrentPosition,pcVar2,sVar3);
    s->CurrentPosition = s->CurrentPosition + sVar3;
  }
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = ')';
  s->CurrentPosition = s->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    Prefix->print(s);
    s += " (";
    s += Suffix;
    s += ")";
  }